

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O1

vrna_exp_param_t * get_scaled_exp_params(vrna_md_t *md,double pfs)

{
  double dVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  vrna_exp_param_t *pvVar6;
  char *pcVar7;
  long lVar8;
  size_t sVar9;
  int (*paaiVar10) [5] [5];
  long lVar11;
  int (*paaiVar12) [5] [5];
  int (*paaiVar13) [5] [5];
  int m_1;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  double (*padVar17) [5];
  double (*padVar18) [8];
  int (*paaiVar19) [5] [5];
  double (*paaadVar20) [8] [5] [5];
  double (*paaadVar21) [8] [5] [5];
  double (*paaadVar22) [8] [5] [5];
  double (*paaaadVar23) [8] [5] [5] [5];
  double (*paaaadVar24) [8] [5] [5] [5];
  double (*paaaadVar25) [8] [5] [5] [5];
  double (*paaaadVar26) [8] [5] [5] [5];
  int (*paaiVar27) [5] [5];
  int (*paaiVar28) [5] [5];
  int (*paaiVar29) [5] [5];
  int (*paaiVar30) [5] [5];
  int (*paaiVar31) [5] [5];
  int (*paaiVar32) [5] [5];
  int (*paiVar33) [5];
  vrna_exp_param_t *pvVar34;
  vrna_exp_param_t *pvVar35;
  int (*paaaaiVar36) [8] [5] [5] [5];
  int (*paiVar37) [5];
  double (*paaaaadVar38) [8] [5] [5] [5] [5];
  double (*paaaaadVar39) [8] [5] [5] [5] [5];
  double (*paaaaadVar40) [8] [5] [5] [5] [5];
  double (*paaaaadVar41) [8] [5] [5] [5] [5];
  double (*paaaaadVar42) [8] [5] [5] [5] [5];
  int m;
  int iVar43;
  int (*paiVar44) [5];
  int (*paaiVar45) [5] [5];
  long lVar46;
  long lVar47;
  ulong uVar48;
  long lVar49;
  int (*paiVar50) [8];
  int (*paaiVar51) [5] [5];
  int (*paaaiVar52) [8] [5] [5];
  int (*paaaaaiVar53) [8] [5] [5] [5] [5];
  int (*paiVar54) [5];
  int (*paiVar55) [5];
  int (*paiVar56) [8];
  long lVar57;
  int (*paaaiVar58) [8] [5] [5];
  int (*paaaaiVar59) [8] [5] [5] [5];
  int (*paaaaaiVar60) [8] [5] [5] [5] [5];
  int (*paiVar61) [5];
  int (*paiVar62) [5];
  int (*paiVar63) [5];
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  int (*local_118) [5];
  int (*local_108) [5];
  int (*local_100) [5];
  int (*local_f8) [5];
  int (*local_f0) [5];
  int (*local_e0) [5];
  int (*local_d8) [5];
  int (*local_b8) [5];
  int (*local_b0) [5];
  
  pvVar6 = (vrna_exp_param_t *)vrna_alloc(0x66760);
  memset(pvVar6->param_file,0,0x100);
  pcVar7 = last_parameter_file();
  if (pcVar7 != (char *)0x0) {
    pcVar7 = last_parameter_file();
    strncpy(pvVar6->param_file,pcVar7,0xff);
  }
  memcpy(&pvVar6->model_details,md,0x7e8);
  dVar1 = md->temperature;
  pvVar6->temperature = dVar1;
  dVar64 = md->betaScale;
  dVar1 = dVar1 + 273.15;
  pvVar6->alpha = dVar64;
  dVar64 = dVar64 * dVar1 * 1.98717;
  pvVar6->kT = dVar64;
  pvVar6->pf_scale = pfs;
  iVar2 = md->pf_smooth;
  dVar1 = dVar1 / Tmeasure;
  pvVar6->lxc = lxc37 * dVar1;
  dVar65 = (double)DuplexInitdH - (double)(DuplexInitdH - DuplexInit37) * dVar1;
  if (iVar2 == 0) {
    dVar65 = (double)(int)dVar65;
  }
  dVar65 = exp((dVar65 * -10.0) / dVar64);
  pvVar6->expDuplexInit = dVar65;
  dVar65 = (double)TerminalAUdH - (double)(TerminalAUdH - TerminalAU37) * dVar1;
  if (iVar2 == 0) {
    dVar65 = (double)(int)dVar65;
  }
  dVar65 = exp((dVar65 * -10.0) / dVar64);
  pvVar6->expTermAU = dVar65;
  dVar65 = (double)ML_BASEdH - (double)(ML_BASEdH - ML_BASE37) * dVar1;
  if (iVar2 == 0) {
    dVar65 = (double)(int)dVar65;
  }
  dVar65 = exp((dVar65 * -10.0) / dVar64);
  pvVar6->expMLbase = dVar65;
  dVar65 = (double)ML_closingdH - (double)(ML_closingdH - ML_closing37) * dVar1;
  if (iVar2 == 0) {
    dVar65 = (double)(int)dVar65;
  }
  dVar65 = exp((dVar65 * -10.0) / dVar64);
  pvVar6->expMLclosing = dVar65;
  dVar65 = (double)GQuadLayerMismatchH -
           (double)(GQuadLayerMismatchH - GQuadLayerMismatch37) * dVar1;
  if (iVar2 == 0) {
    dVar65 = (double)(int)dVar65;
  }
  dVar65 = exp((dVar65 * -10.0) / dVar64);
  pvVar6->expgquadLayerMismatch = dVar65;
  pvVar6->gquadLayerMismatchMax = GQuadLayerMismatchMax;
  local_118 = (int (*) [5])(pvVar6->expgquad[2] + 3);
  lVar8 = 2;
  do {
    lVar49 = 0;
    do {
      iVar5 = GQuadBetadH;
      iVar3 = GQuadAlphadH;
      iVar43 = GQuadAlphadH - GQuadAlpha37;
      iVar14 = GQuadBetadH - GQuadBeta37;
      lVar57 = lVar49 + 1;
      dVar65 = log((double)(int)lVar57);
      dVar65 = ((double)iVar5 - (double)iVar14 * dVar1) * dVar65 +
               ((double)iVar3 - (double)iVar43 * dVar1) * (double)((int)lVar8 - 1);
      if (iVar2 == 0) {
        dVar65 = (double)(int)dVar65;
      }
      dVar65 = exp((dVar65 * -10.0) / dVar64);
      *(double *)((long)local_118 + lVar49 * 8) = dVar65;
      lVar49 = lVar57;
    } while (lVar57 != 0x2b);
    lVar8 = lVar8 + 1;
    local_118 = (int (*) [5])((long)local_118 + 0x170);
  } while (lVar8 != 8);
  lVar8 = 0;
  do {
    dVar65 = (double)hairpindH[lVar8] - (double)(hairpindH[lVar8] - hairpin37[lVar8]) * dVar1;
    if (iVar2 == 0) {
      dVar65 = (double)(int)dVar65;
    }
    dVar65 = exp((dVar65 * -10.0) / dVar64);
    pvVar6->exphairpin[lVar8] = dVar65;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x1f);
  lVar8 = 0;
  do {
    dVar65 = (double)*(int *)((long)bulgedH + lVar8) -
             (double)(*(int *)((long)bulgedH + lVar8) - *(int *)((long)bulge37 + lVar8)) * dVar1;
    if (iVar2 == 0) {
      dVar65 = (double)(int)dVar65;
    }
    dVar65 = exp((dVar65 * -10.0) / dVar64);
    *(double *)((long)pvVar6->expbulge + lVar8 * 2) = dVar65;
    dVar65 = (double)*(int *)((long)internal_loopdH + lVar8) -
             (double)(*(int *)((long)internal_loopdH + lVar8) -
                     *(int *)((long)internal_loop37 + lVar8)) * dVar1;
    if (iVar2 == 0) {
      dVar65 = (double)(int)dVar65;
    }
    dVar65 = exp((dVar65 * -10.0) / dVar64);
    *(double *)((long)pvVar6->expinternal + lVar8 * 2) = dVar65;
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x7c);
  if (james_rule != 0) {
    dVar65 = exp(-800.0 / dVar64);
    pvVar6->expinternal[2] = dVar65;
  }
  dVar65 = (double)niniodH - (double)(niniodH - ninio37) * dVar1;
  if (iVar2 == 0) {
    dVar65 = (double)(int)dVar65;
  }
  lVar8 = 0;
  do {
    dVar67 = (double)(int)lVar8 * dVar65;
    dVar66 = (double)MAX_NINIO;
    if (dVar67 <= (double)MAX_NINIO) {
      dVar66 = dVar67;
    }
    dVar66 = exp((dVar66 * -10.0) / dVar64);
    pvVar6->expninio[2][lVar8] = dVar66;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x1f);
  if (Tetraloops[0] != '\0') {
    uVar16 = 0;
    uVar48 = 7;
    do {
      dVar65 = (double)TetraloopdH[uVar16] -
               (double)(TetraloopdH[uVar16] - Tetraloop37[uVar16]) * dVar1;
      if (iVar2 == 0) {
        dVar65 = (double)(int)dVar65;
      }
      dVar65 = exp((dVar65 * -10.0) / dVar64);
      pvVar6->exptetra[uVar16] = dVar65;
      uVar16 = (ulong)((int)uVar16 + 1);
      sVar9 = strlen(Tetraloops);
      bVar4 = uVar48 < sVar9;
      uVar48 = (ulong)((int)uVar48 + 7);
    } while (bVar4);
  }
  if (Triloops[0] != '\0') {
    uVar16 = 0;
    uVar48 = 5;
    do {
      dVar65 = (double)TriloopdH[uVar16] - (double)(TriloopdH[uVar16] - Triloop37[uVar16]) * dVar1;
      if (iVar2 == 0) {
        dVar65 = (double)(int)dVar65;
      }
      dVar65 = exp((dVar65 * -10.0) / dVar64);
      pvVar6->exptri[uVar16] = dVar65;
      uVar16 = (ulong)((int)uVar16 + 1);
      sVar9 = strlen(Triloops);
      bVar4 = uVar48 < sVar9;
      uVar48 = (ulong)((int)uVar48 + 5);
    } while (bVar4);
  }
  if (Hexaloops[0] != '\0') {
    uVar15 = 0;
    uVar48 = 9;
    do {
      dVar65 = (double)HexaloopdH[uVar15] -
               (double)(HexaloopdH[uVar15] - Hexaloop37[uVar15]) * dVar1;
      if (iVar2 == 0) {
        dVar65 = (double)(int)dVar65;
      }
      dVar65 = exp((dVar65 * -10.0) / dVar64);
      pvVar6->exphex[uVar15] = dVar65;
      uVar15 = uVar15 + 1;
      sVar9 = strlen(Hexaloops);
      bVar4 = uVar48 < sVar9;
      uVar48 = (ulong)((int)uVar48 + 9);
    } while (bVar4);
  }
  lVar8 = 0xc7fb;
  do {
    dVar65 = (double)ML_interndH - (double)(ML_interndH - ML_intern37) * dVar1;
    if (iVar2 == 0) {
      dVar65 = (double)(int)dVar65;
    }
    dVar65 = exp((dVar65 * -10.0) / dVar64);
    *(double *)((long)(pvVar6->expstack + -1) + 0x38 + lVar8 * 8) = dVar65;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0xc803);
  padVar17 = pvVar6->expdangle5;
  local_d8 = dangle5_dH;
  paiVar55 = dangle5_37;
  paiVar33 = dangle3_dH;
  paiVar44 = dangle3_37;
  lVar8 = 0;
  do {
    lVar49 = 0;
    do {
      if (md->dangles == 0) {
        *(undefined8 *)((long)*padVar17 + lVar49 * 2) = 0x3ff0000000000000;
        dVar65 = 1.0;
      }
      else {
        iVar3 = *(int *)((long)*local_d8 + lVar49);
        dVar65 = (double)iVar3 - (double)(iVar3 - *(int *)((long)*paiVar55 + lVar49)) * dVar1;
        if (iVar2 == 0) {
          dVar66 = 0.0;
          if ((int)dVar65 < 1) {
            dVar66 = -(double)(int)dVar65;
          }
        }
        else {
          dVar67 = dVar65 / -10.0;
          dVar66 = 0.0;
          if (-1.2283697 <= dVar67) {
            if (dVar67 <= 0.8660254) {
              dVar65 = sin(dVar67 + -0.34242663);
              iVar3 = *(int *)((long)*local_d8 + lVar49);
              dVar66 = sin(((double)iVar3 -
                           (double)(iVar3 - *(int *)((long)*paiVar55 + lVar49)) * dVar1) / -10.0 +
                           -0.34242663);
              dVar66 = (dVar66 + 1.0) * (dVar65 + 1.0) * 3.8490018;
            }
            else {
              dVar66 = -dVar65;
            }
          }
        }
        dVar65 = exp((dVar66 * 10.0) / dVar64);
        *(double *)((long)*padVar17 + lVar49 * 2) = dVar65;
        iVar3 = *(int *)((long)*paiVar33 + lVar49);
        dVar65 = (double)iVar3 - (double)(iVar3 - *(int *)((long)*paiVar44 + lVar49)) * dVar1;
        if (iVar2 == 0) {
          dVar66 = 0.0;
          if ((int)dVar65 < 1) {
            dVar66 = -(double)(int)dVar65;
          }
        }
        else {
          dVar67 = dVar65 / -10.0;
          dVar66 = 0.0;
          if (-1.2283697 <= dVar67) {
            if (dVar67 <= 0.8660254) {
              dVar65 = sin(dVar67 + -0.34242663);
              iVar3 = *(int *)((long)*paiVar33 + lVar49);
              dVar66 = sin(((double)iVar3 -
                           (double)(iVar3 - *(int *)((long)*paiVar44 + lVar49)) * dVar1) / -10.0 +
                           -0.34242663);
              dVar66 = (dVar66 + 1.0) * (dVar65 + 1.0) * 3.8490018;
            }
            else {
              dVar66 = -dVar65;
            }
          }
        }
        dVar65 = exp((dVar66 * 10.0) / dVar64);
      }
      *(double *)((long)padVar17[8] + lVar49 * 2) = dVar65;
      lVar49 = lVar49 + 4;
    } while (lVar49 != 0x14);
    lVar8 = lVar8 + 1;
    padVar17 = padVar17 + 1;
    local_d8 = local_d8 + 1;
    paiVar55 = paiVar55 + 1;
    paiVar33 = paiVar33 + 1;
    paiVar44 = paiVar44 + 1;
  } while (lVar8 != 8);
  padVar18 = pvVar6->expstack;
  paiVar50 = stackdH;
  paiVar56 = stack37;
  lVar8 = 0;
  do {
    lVar49 = 0;
    do {
      iVar3 = *(int *)((long)*paiVar50 + lVar49);
      dVar65 = (double)iVar3 - (double)(iVar3 - *(int *)((long)*paiVar56 + lVar49)) * dVar1;
      if (iVar2 == 0) {
        dVar65 = (double)(int)dVar65;
      }
      dVar65 = exp((dVar65 * -10.0) / dVar64);
      *(double *)((long)*padVar18 + lVar49 * 2) = dVar65;
      lVar49 = lVar49 + 4;
    } while (lVar49 != 0x20);
    lVar8 = lVar8 + 1;
    paiVar50 = paiVar50 + 1;
    paiVar56 = paiVar56 + 1;
    padVar18 = padVar18 + 1;
  } while (lVar8 != 8);
  paaiVar45 = mismatchIdH;
  paaiVar19 = mismatchI37;
  paaiVar51 = mismatch1nIdH;
  paaiVar10 = mismatch1nI37;
  paaiVar12 = mismatchHdH;
  paaiVar13 = mismatchH37;
  paaiVar27 = mismatch23IdH;
  paaiVar28 = mismatch23I37;
  paaiVar29 = mismatchMdH;
  paaiVar30 = mismatchM37;
  paaiVar31 = mismatchExtdH;
  paaiVar32 = mismatchExt37;
  lVar8 = 0;
  pvVar34 = pvVar6;
  do {
    lVar49 = 0;
    paiVar33 = *paaiVar19;
    pvVar35 = pvVar34;
    paiVar44 = *paaiVar45;
    paiVar55 = *paaiVar51;
    local_118 = *paaiVar27;
    local_108 = *paaiVar13;
    local_100 = *paaiVar12;
    local_f8 = *paaiVar31;
    local_f0 = *paaiVar32;
    local_e0 = *paaiVar10;
    local_d8 = *paaiVar28;
    local_b8 = *paaiVar29;
    local_b0 = *paaiVar30;
    do {
      lVar57 = 0;
      do {
        iVar3 = *(int *)((long)*(int (*) [5])*paiVar44 + lVar57);
        dVar65 = (double)iVar3 -
                 (double)(iVar3 - *(int *)((long)*(int (*) [5])*paiVar33 + lVar57)) * dVar1;
        if (iVar2 == 0) {
          dVar65 = (double)(int)dVar65;
        }
        dVar65 = exp((dVar65 * -10.0) / dVar64);
        *(double *)((long)pvVar35->expmismatchI[0][0] + lVar57 * 2) = dVar65;
        iVar3 = *(int *)((long)*(int (*) [5])*paiVar55 + lVar57);
        dVar65 = (double)iVar3 -
                 (double)(iVar3 - *(int *)((long)*(int (*) [5])*local_e0 + lVar57)) * dVar1;
        if (iVar2 == 0) {
          dVar65 = (double)(int)dVar65;
        }
        dVar65 = exp((dVar65 * -10.0) / dVar64);
        *(double *)((long)pvVar35->expmismatch1nI[0][0] + lVar57 * 2) = dVar65;
        iVar3 = *(int *)((long)*(int (*) [5])*local_100 + lVar57);
        dVar65 = (double)iVar3 -
                 (double)(iVar3 - *(int *)((long)*(int (*) [5])*local_108 + lVar57)) * dVar1;
        if (iVar2 == 0) {
          dVar65 = (double)(int)dVar65;
        }
        dVar65 = exp((dVar65 * -10.0) / dVar64);
        *(double *)((long)pvVar35->expmismatchH[0][0] + lVar57 * 2) = dVar65;
        iVar3 = *(int *)((long)*(int (*) [5])*local_118 + lVar57);
        dVar65 = (double)iVar3 -
                 (double)(iVar3 - *(int *)((long)*(int (*) [5])*local_d8 + lVar57)) * dVar1;
        if (iVar2 == 0) {
          dVar65 = (double)(int)dVar65;
        }
        dVar65 = exp((dVar65 * -10.0) / dVar64);
        *(double *)((long)pvVar35->expmismatch23I[0][0] + lVar57 * 2) = dVar65;
        if (md->dangles == 0) {
          *(undefined8 *)((long)pvVar35->expmismatchExt[0][0] + lVar57 * 2) = 0x3ff0000000000000;
          lVar11 = 0x2430;
          dVar65 = 1.0;
        }
        else {
          iVar3 = *(int *)((long)*(int (*) [5])*local_b8 + lVar57);
          dVar65 = (double)iVar3 -
                   (double)(iVar3 - *(int *)((long)*(int (*) [5])*local_b0 + lVar57)) * dVar1;
          if (iVar2 == 0) {
            dVar66 = 0.0;
            if ((int)dVar65 < 1) {
              dVar66 = -(double)(int)dVar65;
            }
          }
          else {
            dVar67 = dVar65 / -10.0;
            dVar66 = 0.0;
            if (-1.2283697 <= dVar67) {
              if (dVar67 <= 0.8660254) {
                dVar65 = sin(dVar67 + -0.34242663);
                iVar3 = *(int *)((long)*(int (*) [5])*local_b8 + lVar57);
                dVar66 = sin(((double)iVar3 -
                             (double)(iVar3 - *(int *)((long)*(int (*) [5])*local_b0 + lVar57)) *
                             dVar1) / -10.0 + -0.34242663);
                dVar66 = (dVar66 + 1.0) * (dVar65 + 1.0) * 3.8490018;
              }
              else {
                dVar66 = -dVar65;
              }
            }
          }
          dVar65 = exp((dVar66 * 10.0) / dVar64);
          *(double *)((long)pvVar35->expmismatchM[0][0] + lVar57 * 2) = dVar65;
          iVar3 = *(int *)((long)*(int (*) [5])*local_f8 + lVar57);
          dVar65 = (double)iVar3 -
                   (double)(iVar3 - *(int *)((long)*(int (*) [5])*local_f0 + lVar57)) * dVar1;
          if (iVar2 == 0) {
            dVar66 = 0.0;
            if ((int)dVar65 < 1) {
              dVar66 = -(double)(int)dVar65;
            }
          }
          else {
            dVar67 = dVar65 / -10.0;
            dVar66 = 0.0;
            if (-1.2283697 <= dVar67) {
              if (dVar67 <= 0.8660254) {
                dVar65 = sin(dVar67 + -0.34242663);
                iVar3 = *(int *)((long)*(int (*) [5])*local_f8 + lVar57);
                dVar66 = sin(((double)iVar3 -
                             (double)(iVar3 - *(int *)((long)*(int (*) [5])*local_f0 + lVar57)) *
                             dVar1) / -10.0 + -0.34242663);
                dVar66 = (dVar66 + 1.0) * (dVar65 + 1.0) * 3.8490018;
              }
              else {
                dVar66 = -dVar65;
              }
            }
          }
          dVar65 = exp((dVar66 * 10.0) / dVar64);
          lVar11 = 0x4f0;
        }
        *(double *)((long)(pvVar35->expstack + -1) + 0x38 + lVar57 * 2 + lVar11) = dVar65;
        lVar57 = lVar57 + 4;
      } while (lVar57 != 0x14);
      lVar49 = lVar49 + 1;
      pvVar35 = (vrna_exp_param_t *)(pvVar35->expstack[0] + 4);
      paiVar44 = paiVar44 + 1;
      paiVar33 = paiVar33 + 1;
      paiVar55 = paiVar55 + 1;
      local_e0 = local_e0 + 1;
      local_100 = local_100 + 1;
      local_108 = local_108 + 1;
      local_118 = local_118 + 1;
      local_d8 = local_d8 + 1;
      local_b8 = local_b8 + 1;
      local_b0 = local_b0 + 1;
      local_f8 = local_f8 + 1;
      local_f0 = local_f0 + 1;
    } while (lVar49 != 5);
    lVar8 = lVar8 + 1;
    pvVar34 = (vrna_exp_param_t *)(pvVar34->expstack + 3);
    paaiVar45 = (int (*) [5] [5])((long)paaiVar45 + 100);
    paaiVar19 = (int (*) [5] [5])((long)paaiVar19 + 100);
    paaiVar51 = (int (*) [5] [5])((long)paaiVar51 + 100);
    paaiVar10 = (int (*) [5] [5])((long)paaiVar10 + 100);
    paaiVar12 = (int (*) [5] [5])((long)paaiVar12 + 100);
    paaiVar13 = (int (*) [5] [5])((long)paaiVar13 + 100);
    paaiVar27 = (int (*) [5] [5])((long)paaiVar27 + 100);
    paaiVar28 = (int (*) [5] [5])((long)paaiVar28 + 100);
    paaiVar29 = (int (*) [5] [5])((long)paaiVar29 + 100);
    paaiVar30 = (int (*) [5] [5])((long)paaiVar30 + 100);
    paaiVar31 = (int (*) [5] [5])((long)paaiVar31 + 100);
    paaiVar32 = (int (*) [5] [5])((long)paaiVar32 + 100);
  } while (lVar8 != 8);
  paaadVar20 = pvVar6->expint11;
  paaaiVar52 = int11_dH;
  paaaiVar58 = int11_37;
  lVar8 = 0;
  do {
    lVar49 = 0;
    paaadVar21 = paaadVar20;
    paiVar33 = (int (*) [5])paaaiVar52;
    paiVar44 = (int (*) [5])paaaiVar58;
    do {
      lVar57 = 0;
      paaadVar22 = paaadVar21;
      paiVar55 = paiVar33;
      paiVar61 = paiVar44;
      do {
        lVar11 = 0;
        do {
          iVar3 = (*(int (*) [5] [5])*paiVar55)[0][lVar11];
          dVar65 = (double)iVar3 -
                   (double)(iVar3 - (*(int (*) [5] [5])*paiVar61)[0][lVar11]) * dVar1;
          if (iVar2 == 0) {
            dVar65 = (double)(int)dVar65;
          }
          dVar65 = exp((dVar65 * -10.0) / dVar64);
          (*paaadVar22)[0][0][lVar11] = dVar65;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 5);
        lVar57 = lVar57 + 1;
        paiVar55 = paiVar55 + 1;
        paiVar61 = paiVar61 + 1;
        paaadVar22 = (double (*) [8] [5] [5])((*paaadVar22)[0] + 1);
      } while (lVar57 != 5);
      lVar49 = lVar49 + 1;
      paiVar33 = paiVar33 + 5;
      paiVar44 = paiVar44 + 5;
      paaadVar21 = (double (*) [8] [5] [5])(*paaadVar21 + 1);
    } while (lVar49 != 8);
    lVar8 = lVar8 + 1;
    paaaiVar52 = (int (*) [8] [5] [5])((long)paaaiVar52 + 800);
    paaaiVar58 = (int (*) [8] [5] [5])((long)paaaiVar58 + 800);
    paaadVar20 = paaadVar20 + 1;
  } while (lVar8 != 8);
  paaaadVar23 = pvVar6->expint21;
  paaaaiVar36 = int21_dH;
  paaaaiVar59 = int21_37;
  lVar8 = 0;
  do {
    lVar49 = 0;
    paaaadVar24 = paaaadVar23;
    paiVar33 = (int (*) [5])paaaaiVar36;
    paiVar44 = (int (*) [5])paaaaiVar59;
    do {
      lVar57 = 0;
      paaaadVar25 = paaaadVar24;
      paiVar55 = paiVar33;
      paiVar61 = paiVar44;
      do {
        lVar11 = 0;
        paaaadVar26 = paaaadVar25;
        paiVar37 = paiVar55;
        paiVar62 = paiVar61;
        do {
          lVar46 = 0;
          do {
            iVar3 = (*(int (*) [5] [5] [5])*paiVar37)[0][0][lVar46];
            dVar65 = (double)iVar3 -
                     (double)(iVar3 - (*(int (*) [5] [5] [5])*paiVar62)[0][0][lVar46]) * dVar1;
            if (iVar2 == 0) {
              dVar65 = (double)(int)dVar65;
            }
            dVar65 = exp((dVar65 * -10.0) / dVar64);
            (*paaaadVar26)[0][0][0][lVar46] = dVar65;
            lVar46 = lVar46 + 1;
          } while (lVar46 != 5);
          lVar11 = lVar11 + 1;
          paiVar37 = paiVar37 + 1;
          paiVar62 = paiVar62 + 1;
          paaaadVar26 = (double (*) [8] [5] [5] [5])((*paaaadVar26)[0][0] + 1);
        } while (lVar11 != 5);
        lVar57 = lVar57 + 1;
        paiVar55 = paiVar55 + 5;
        paiVar61 = paiVar61 + 5;
        paaaadVar25 = (double (*) [8] [5] [5] [5])((*paaaadVar25)[0] + 1);
      } while (lVar57 != 5);
      lVar49 = lVar49 + 1;
      paiVar33 = paiVar33 + 0x19;
      paiVar44 = paiVar44 + 0x19;
      paaaadVar24 = (double (*) [8] [5] [5] [5])(*paaaadVar24 + 1);
    } while (lVar49 != 8);
    lVar8 = lVar8 + 1;
    paaaaiVar36 = (int (*) [8] [5] [5] [5])((long)paaaaiVar36 + 4000);
    paaaaiVar59 = (int (*) [8] [5] [5] [5])((long)paaaaiVar59 + 4000);
    paaaadVar23 = paaaadVar23 + 1;
  } while (lVar8 != 8);
  paaaaadVar38 = pvVar6->expint22;
  paaaaaiVar53 = int22_dH;
  paaaaaiVar60 = int22_37;
  lVar8 = 0;
  do {
    lVar49 = 0;
    paaaaadVar39 = paaaaadVar38;
    paiVar33 = (int (*) [5])paaaaaiVar53;
    paiVar44 = (int (*) [5])paaaaaiVar60;
    do {
      lVar57 = 0;
      paaaaadVar40 = paaaaadVar39;
      paiVar55 = paiVar33;
      paiVar61 = paiVar44;
      do {
        lVar11 = 0;
        paaaaadVar41 = paaaaadVar40;
        paiVar37 = paiVar55;
        paiVar62 = paiVar61;
        do {
          lVar46 = 0;
          paaaaadVar42 = paaaaadVar41;
          paiVar54 = paiVar37;
          paiVar63 = paiVar62;
          do {
            lVar47 = 0;
            do {
              iVar3 = (*(int (*) [5] [5] [5] [5])*paiVar54)[0][0][0][lVar47];
              dVar65 = (double)iVar3 -
                       (double)(iVar3 - (*(int (*) [5] [5] [5] [5])*paiVar63)[0][0][0][lVar47]) *
                       dVar1;
              if (iVar2 == 0) {
                dVar65 = (double)(int)dVar65;
              }
              dVar65 = exp((dVar65 * -10.0) / dVar64);
              (*paaaaadVar42)[0][0][0][0][lVar47] = dVar65;
              lVar47 = lVar47 + 1;
            } while (lVar47 != 5);
            lVar46 = lVar46 + 1;
            paiVar54 = paiVar54 + 1;
            paiVar63 = paiVar63 + 1;
            paaaaadVar42 = (double (*) [8] [5] [5] [5] [5])((*paaaaadVar42)[0][0][0] + 1);
          } while (lVar46 != 5);
          lVar11 = lVar11 + 1;
          paiVar37 = paiVar37 + 5;
          paiVar62 = paiVar62 + 5;
          paaaaadVar41 = (double (*) [8] [5] [5] [5] [5])((*paaaaadVar41)[0][0] + 1);
        } while (lVar11 != 5);
        lVar57 = lVar57 + 1;
        paiVar55 = paiVar55 + 0x19;
        paiVar61 = paiVar61 + 0x19;
        paaaaadVar40 = (double (*) [8] [5] [5] [5] [5])((*paaaaadVar40)[0] + 1);
      } while (lVar57 != 5);
      lVar49 = lVar49 + 1;
      paiVar33 = paiVar33 + 0x7d;
      paiVar44 = paiVar44 + 0x7d;
      paaaaadVar39 = (double (*) [8] [5] [5] [5] [5])(*paaaaadVar39 + 1);
    } while (lVar49 != 8);
    lVar8 = lVar8 + 1;
    paaaaaiVar53 = (int (*) [8] [5] [5] [5] [5])((long)paaaaaiVar53 + 20000);
    paaaaaiVar60 = (int (*) [8] [5] [5] [5] [5])((long)paaaaaiVar60 + 20000);
    paaaaadVar38 = paaaaadVar38 + 1;
  } while (lVar8 != 8);
  strncpy(pvVar6->Tetraloops,Tetraloops,0x119);
  strncpy(pvVar6->Triloops,Triloops,0xf1);
  strncpy(pvVar6->Hexaloops,Hexaloops,0x169);
  return pvVar6;
}

Assistant:

PRIVATE vrna_exp_param_t *
get_scaled_exp_params(vrna_md_t *md,
                      double    pfs)
{
  unsigned int      i, j, k, l;
  int               pf_smooth;
  double            kT, TT;
  double            GT;
  vrna_exp_param_t  *pf;

  pf = (vrna_exp_param_t *)vrna_alloc(sizeof(vrna_exp_param_t));

  memset(pf->param_file, '\0', 256);
  if (last_parameter_file() != NULL)
    strncpy(pf->param_file, last_parameter_file(), 255);

  pf->model_details = *md;
  pf->temperature   = md->temperature;
  pf->alpha         = md->betaScale;
  pf->kT            = kT = md->betaScale * (md->temperature + K0) * GASCONST; /* kT in cal/mol  */
  pf->pf_scale      = pfs;
  pf_smooth         = md->pf_smooth;
  TT                = (md->temperature + K0) / (Tmeasure);

  pf->lxc                   = lxc37 * TT;
  pf->expDuplexInit         = RESCALE_BF(DuplexInit37, DuplexInitdH, TT, kT);
  pf->expTermAU             = RESCALE_BF(TerminalAU37, TerminalAUdH, TT, kT);
  pf->expMLbase             = RESCALE_BF(ML_BASE37, ML_BASEdH, TT, kT);
  pf->expMLclosing          = RESCALE_BF(ML_closing37, ML_closingdH, TT, kT);
  pf->expgquadLayerMismatch = RESCALE_BF(GQuadLayerMismatch37, GQuadLayerMismatchH, TT, kT);
  pf->gquadLayerMismatchMax = GQuadLayerMismatchMax;

  for (i = VRNA_GQUAD_MIN_STACK_SIZE; i <= VRNA_GQUAD_MAX_STACK_SIZE; i++)
    for (j = 3 * VRNA_GQUAD_MIN_LINKER_LENGTH; j <= 3 * VRNA_GQUAD_MAX_LINKER_LENGTH; j++) {
      double  GQuadAlpha_T  = RESCALE_dG(GQuadAlpha37, GQuadAlphadH, TT);
      double  GQuadBeta_T   = RESCALE_dG(GQuadBeta37, GQuadBetadH, TT);
      GT = ((double)GQuadAlpha_T) * ((double)(i - 1)) + ((double)GQuadBeta_T) *
           log(((double)j) - 2.);
      pf->expgquad[i][j] = exp(-TRUNC_MAYBE(GT) * 10. / kT);
    }

  /* loop energies: hairpins, bulges, interior, mulit-loops */
  for (i = 0; i < 31; i++)
    pf->exphairpin[i] = RESCALE_BF(hairpin37[i], hairpindH[i], TT, kT);

  for (i = 0; i <= MIN2(30, MAXLOOP); i++) {
    pf->expbulge[i]     = RESCALE_BF(bulge37[i], bulgedH[i], TT, kT);
    pf->expinternal[i]  = RESCALE_BF(internal_loop37[i], internal_loopdH[i], TT, kT);
  }

  /* special case of size 2 interior loops (single mismatch) */
  if (james_rule)
    pf->expinternal[2] = exp(-80 * 10. / kT);

  GT = RESCALE_dG(bulge37[30],
                  bulgedH[30],
                  TT);
  for (i = 31; i <= MAXLOOP; i++)
    pf->expbulge[i] = exp(-TRUNC_MAYBE(GT + (pf->lxc * log(i / 30.))) * 10. / kT);

  GT = RESCALE_dG(internal_loop37[30],
                  internal_loopdH[30],
                  TT);
  for (i = 31; i <= MAXLOOP; i++)
    pf->expinternal[i] = exp(-TRUNC_MAYBE(GT + (pf->lxc * log(i / 30.))) * 10. / kT);

  GT = RESCALE_dG(ninio37, niniodH, TT);
  for (j = 0; j <= MAXLOOP; j++)
    pf->expninio[2][j] = exp(-MIN2(MAX_NINIO, j * TRUNC_MAYBE(GT)) * 10. / kT);

  for (i = 0; (i * 7) < strlen(Tetraloops); i++)
    pf->exptetra[i] = RESCALE_BF(Tetraloop37[i], TetraloopdH[i], TT, kT);

  for (i = 0; (i * 5) < strlen(Triloops); i++)
    pf->exptri[i] = RESCALE_BF(Triloop37[i], TriloopdH[i], TT, kT);

  for (i = 0; (i * 9) < strlen(Hexaloops); i++)
    pf->exphex[i] = RESCALE_BF(Hexaloop37[i], HexaloopdH[i], TT, kT);

  for (i = 0; i <= NBPAIRS; i++)
    pf->expMLintern[i] = RESCALE_BF(ML_intern37, ML_interndH, TT, kT);

  /* if dangles==0 just set their energy to 0,
   * don't let dangle energies become > 0 (at large temps),
   * but make sure go smoothly to 0                        */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= 4; j++) {
      if (md->dangles) {
        pf->expdangle5[i][j]  = RESCALE_BF_SMOOTH(dangle5_37[i][j], dangle5_dH[i][j], TT, kT);
        pf->expdangle3[i][j]  = RESCALE_BF_SMOOTH(dangle3_37[i][j], dangle3_dH[i][j], TT, kT);
      } else {
        pf->expdangle3[i][j] = pf->expdangle5[i][j] = 1;
      }
    }

  /* stacking energies */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      pf->expstack[i][j] = RESCALE_BF(stack37[i][j], stackdH[i][j], TT, kT);

  /* mismatch energies */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j < 5; j++)
      for (k = 0; k < 5; k++) {
        pf->expmismatchI[i][j][k] = RESCALE_BF(mismatchI37[i][j][k],
                                               mismatchIdH[i][j][k],
                                               TT,
                                               kT);
        pf->expmismatch1nI[i][j][k] = RESCALE_BF(mismatch1nI37[i][j][k],
                                                 mismatch1nIdH[i][j][k],
                                                 TT,
                                                 kT);
        pf->expmismatchH[i][j][k] = RESCALE_BF(mismatchH37[i][j][k],
                                               mismatchHdH[i][j][k],
                                               TT,
                                               kT);
        pf->expmismatch23I[i][j][k] = RESCALE_BF(mismatch23I37[i][j][k],
                                                 mismatch23IdH[i][j][k],
                                                 TT,
                                                 kT);

        if (md->dangles) {
          pf->expmismatchM[i][j][k] = RESCALE_BF_SMOOTH(mismatchM37[i][j][k],
                                                        mismatchMdH[i][j][k],
                                                        TT,
                                                        kT);
          pf->expmismatchExt[i][j][k] = RESCALE_BF_SMOOTH(mismatchExt37[i][j][k],
                                                          mismatchExtdH[i][j][k],
                                                          TT,
                                                          kT);
        } else {
          pf->expmismatchM[i][j][k] = pf->expmismatchExt[i][j][k] = 1.;
        }
      }

  /* interior lops of length 2 */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          pf->expint11[i][j][k][l] = RESCALE_BF(int11_37[i][j][k][l],
                                                int11_dH[i][j][k][l],
                                                TT,
                                                kT);
        }

  /* interior 2x1 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          int m;
          for (m = 0; m < 5; m++) {
            pf->expint21[i][j][k][l][m] = RESCALE_BF(int21_37[i][j][k][l][m],
                                                     int21_dH[i][j][k][l][m],
                                                     TT,
                                                     kT);
          }
        }

  /* interior 2x2 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          int m, n;
          for (m = 0; m < 5; m++)
            for (n = 0; n < 5; n++) {
              pf->expint22[i][j][k][l][m][n] = RESCALE_BF(int22_37[i][j][k][l][m][n],
                                                          int22_dH[i][j][k][l][m][n],
                                                          TT,
                                                          kT);
            }
        }

  strncpy(pf->Tetraloops, Tetraloops, 281);
  strncpy(pf->Triloops, Triloops, 241);
  strncpy(pf->Hexaloops, Hexaloops, 361);

  return pf;
}